

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O2

ParquetIntervalTargetType __thiscall
duckdb::ParquetIntervalOperator::Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
          (ParquetIntervalOperator *this,interval_t input)

{
  undefined1 auVar1 [16];
  IOException *this_00;
  ParquetIntervalTargetType PVar2;
  allocator local_39;
  string local_38;
  
  if ((((ulong)this & 0x8000000080000000) == 0) && (-1 < (long)input._0_8_)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = input._0_8_;
    PVar2.bytes._8_4_ = SUB164(auVar1 / ZEXT816(1000),0);
    PVar2.bytes._0_8_ = this;
    return (ParquetIntervalTargetType)PVar2.bytes;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Parquet files do not support negative intervals",&local_39);
  IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static TGT Operation(SRC input) {
		if (input.days < 0 || input.months < 0 || input.micros < 0) {
			throw IOException("Parquet files do not support negative intervals");
		}
		TGT result;
		Store<uint32_t>(input.months, result.bytes);
		Store<uint32_t>(input.days, result.bytes + sizeof(uint32_t));
		Store<uint32_t>(input.micros / 1000, result.bytes + sizeof(uint32_t) * 2);
		return result;
	}